

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeLlvm.cpp
# Opt level: O2

LLVMValueRef CompileLlvmArrayIndex(LlvmCompilationContext *ctx,ExprArrayIndex *node)

{
  LLVMValueRef pLVar1;
  
  CompileLlvm(ctx,node->value);
  CompileLlvm(ctx,node->index);
  pLVar1 = CheckType(ctx,&node->super_ExprBase,(LLVMValueRef)&placeholderValue);
  return pLVar1;
}

Assistant:

LLVMValueRef CompileLlvmArrayIndex(LlvmCompilationContext &ctx, ExprArrayIndex *node)
{
	LLVMValueRef value = CompileLlvm(ctx, node->value);
	LLVMValueRef index = CompileLlvm(ctx, node->index);

	if(isType<TypeUnsizedArray>(node->value->type))
	{
		// TODO: bounds checking
		LLVMValueRef start = LLVMBuildExtractValue(ctx.builder, value, 0, "arr_ptr");

		LLVMValueRef indices[] = { index };

		return CheckType(ctx, node, LLVMBuildGEP(ctx.builder, start, indices, 1, ""));
	}

	// TODO: bounds checking
	LLVMValueRef indices[] = { LLVMConstInt(LLVMInt32TypeInContext(ctx.context), 0, true), index };

	return CheckType(ctx, node, LLVMBuildGEP(ctx.builder, value, indices, 2, ""));
}